

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

bool __thiscall
xray_re::xr_ini_file::ini_section::line_exist(ini_section *this,char *lname,char **lvalue)

{
  ini_item *piVar1;
  int iVar2;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  _Var3;
  
  _Var3 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_pred>
                    ((__normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                      )(this->items).
                       super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                      )(this->items).
                       super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(ini_item_pred)lname);
  if (_Var3._M_current !=
      (this->items).
      super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar1 = *_Var3._M_current;
    iVar2 = strcasecmp((piVar1->name)._M_dataplus._M_p,lname);
    if (iVar2 == 0) {
      if (lvalue == (char **)0x0) {
        return true;
      }
      *lvalue = (piVar1->value)._M_dataplus._M_p;
      return true;
    }
  }
  return false;
}

Assistant:

bool xr_ini_file::ini_section::line_exist(const char* lname, const char** lvalue) const
{
	ini_item_vec_cit it = lower_bound_if(begin(), end(), ini_item_pred(lname));
	if (it == end() || xr_stricmp((*it)->name.c_str(), lname) != 0)
		return false;
	if (lvalue)
		*lvalue = (*it)->value.c_str();
	return true;
}